

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

FaceData * __thiscall
Ptex::v2_2::PtexReader::TiledFaceBase::reduce
          (TiledFaceBase *this,PtexReader *r,Res newres,ReduceFn *reducefn,size_t *newMemUsed)

{
  byte bVar1;
  Res RVar2;
  uint32_t uVar3;
  DataType DVar4;
  _func_int *p_Var5;
  code *pcVar6;
  byte bVar7;
  long lVar8;
  ReduceFn *pRVar9;
  int8_t iVar10;
  int8_t iVar11;
  byte bVar12;
  char cVar13;
  int iVar14;
  int iVar15;
  long *plVar16;
  void *pvVar17;
  void *pvVar18;
  TiledReducedFace *pTVar19;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *dst;
  undefined4 extraout_var_02;
  Res RVar20;
  uint uVar21;
  EVP_PKEY_CTX *src;
  int iVar22;
  undefined8 uVar23;
  int i;
  int iVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  bool bVar28;
  undefined8 uStack_90;
  DataType aDStack_88 [2];
  ulong uStack_80;
  TiledReducedFace *local_78;
  ReduceFn *local_70;
  void *local_68;
  size_t *local_60;
  undefined8 *local_58;
  uint local_50;
  int local_4c;
  void *local_48;
  uint local_3c;
  uint local_38;
  Res local_32 [4];
  Res newres_local;
  undefined4 extraout_var;
  
  uVar3 = (r->_header).meshtype;
  bVar1 = newres.vlog2;
  bVar12 = bVar1;
  RVar20 = newres;
  if (uVar3 != 0) {
    RVar2 = this->_tileres;
    RVar20 = RVar2;
    if (newres.ulog2 < RVar2.ulog2) {
      RVar20 = (Res)((ushort)newres & 0xff);
    }
    bVar12 = RVar2.vlog2;
    if ((char)bVar1 < RVar2.vlog2) {
      bVar12 = bVar1;
    }
  }
  RVar20 = (Res)((ushort)RVar20 & 0xff | (ushort)bVar12 << 8);
  uStack_80 = 0x5652ad;
  local_70 = reducefn;
  local_32[0] = newres;
  iVar14 = Res::ntiles(local_32,RVar20);
  if (iVar14 == 1) {
    local_60 = newMemUsed;
    uVar27 = (ulong)this->_ntiles;
    lVar8 = -(uVar27 * 8 + 0xf & 0xfffffffffffffff0);
    local_58 = (undefined8 *)((long)&local_78 + lVar8);
    bVar28 = true;
    for (uVar25 = 0; (long)uVar25 < (long)(int)uVar27; uVar25 = uVar25 + 1) {
      p_Var5 = (this->super_FaceData).super_PtexFaceData._vptr_PtexFaceData[9];
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x5652f1;
      iVar14 = (*p_Var5)(this,uVar25 & 0xffffffff);
      plVar16 = (long *)CONCAT44(extraout_var,iVar14);
      local_58[uVar25] = plVar16;
      if (bVar28) {
        pcVar6 = *(code **)(*plVar16 + 0x18);
        *(undefined8 *)((long)&uStack_80 + lVar8) = 0x56530b;
        cVar13 = (*pcVar6)(plVar16);
        if (cVar13 == '\0') goto LAB_00565344;
        if (uVar25 == 0) {
          bVar28 = true;
        }
        else {
          pcVar6 = *(code **)(*(long *)*local_58 + 0x30);
          *(undefined8 *)((long)&uStack_80 + lVar8) = 0x565321;
          pvVar17 = (void *)(*pcVar6)();
          pcVar6 = *(code **)(*plVar16 + 0x30);
          *(undefined8 *)((long)&uStack_80 + lVar8) = 0x56532d;
          pvVar18 = (void *)(*pcVar6)(plVar16);
          iVar14 = this->_pixelsize;
          *(undefined8 *)((long)&uStack_80 + lVar8) = 0x56533c;
          iVar14 = bcmp(pvVar17,pvVar18,(long)iVar14);
          bVar28 = iVar14 == 0;
        }
      }
      else {
LAB_00565344:
        bVar28 = false;
      }
      uVar27 = (ulong)(uint)this->_ntiles;
    }
    if (bVar28) {
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x18;
      uVar25 = *(ulong *)((long)&uStack_80 + lVar8);
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x565367;
      pTVar19 = (TiledReducedFace *)operator_new(uVar25);
      iVar14 = this->_pixelsize;
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x565375;
      ConstantFace::ConstantFace((ConstantFace *)pTVar19,iVar14);
      p_Var5 = (pTVar19->super_TiledFaceBase).super_FaceData.super_PtexFaceData._vptr_PtexFaceData
               [6];
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x56537f;
      iVar15 = (*p_Var5)(pTVar19);
      pcVar6 = *(code **)(*(long *)*local_58 + 0x30);
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x56538f;
      pvVar17 = (void *)(*pcVar6)();
      iVar14 = this->_pixelsize;
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x56539e;
      memcpy((void *)CONCAT44(extraout_var_00,iVar15),pvVar17,(long)iVar14);
      *local_60 = (long)this->_pixelsize + 0x18;
    }
    else if (uVar3 == 0) {
      bVar1 = (this->_tileres).ulog2;
      bVar12 = (this->_tileres).vlog2;
      *(undefined8 *)((long)&uStack_80 + lVar8) = 1;
      uVar23 = *(undefined8 *)((long)&uStack_80 + lVar8);
      local_4c = (int)uVar23 << (bVar1 & 0x1f);
      local_48 = (void *)CONCAT44(local_48._4_4_,(int)uVar23 << (bVar12 & 0x1f));
      iVar14 = this->_pixelsize;
      local_38 = iVar14 << (bVar1 & 0x1f);
      local_3c = local_38 * this->_ntilesu;
      iVar15 = local_4c << (bVar12 & 0x1f);
      local_50 = (local_3c << (bVar12 & 0x1f)) - (this->_ntilesu + -1) * local_38;
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x5655d2;
      pvVar17 = operator_new__((long)(iVar14 * (int)uVar27 * iVar15));
      uVar25 = 0;
      local_68 = pvVar17;
      while ((long)uVar25 < (long)(int)uVar27) {
        plVar16 = (long *)local_58[uVar25];
        pcVar6 = *(code **)(*plVar16 + 0x18);
        *(undefined8 *)((long)&uStack_80 + lVar8) = 0x5655f5;
        cVar13 = (*pcVar6)(plVar16);
        pcVar6 = *(code **)(*plVar16 + 0x30);
        *(undefined8 *)((long)&uStack_80 + lVar8) = 0x565601;
        dst = (EVP_PKEY_CTX *)(*pcVar6)(plVar16);
        uVar21 = local_3c;
        iVar14 = local_4c;
        if (cVar13 == '\0') {
          src = (EVP_PKEY_CTX *)(ulong)local_38;
          *(undefined8 *)((long)&uStack_80 + lVar8) = 0x565639;
          PtexUtils::copy(dst,src);
        }
        else {
          iVar15 = this->_pixelsize;
          iVar24 = (int)local_48;
          *(undefined8 *)((long)&uStack_80 + lVar8) = 0x56561f;
          PtexUtils::fill(dst,pvVar17,uVar21,iVar14,iVar24,iVar15);
        }
        uVar21 = local_50;
        uVar25 = uVar25 + 1;
        iVar14 = this->_ntilesu;
        *(undefined8 *)((long)&uStack_80 + lVar8) = 1;
        uVar23 = *(undefined8 *)((long)&uStack_80 + lVar8);
        if ((int)((long)((ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff) %
                 (long)iVar14) != 0) {
          uVar21 = local_38;
        }
        pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar21);
        uVar27 = (ulong)(uint)this->_ntiles;
      }
      iVar14 = this->_pixelsize;
      iVar22 = (int)uVar23;
      iVar15 = ((iVar22 << (local_32[0].ulog2 & 0x1fU)) << (local_32[0].vlog2 & 0x1fU)) * iVar14;
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x18;
      uVar25 = *(ulong *)((long)&uStack_80 + lVar8);
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x56567d;
      pTVar19 = (TiledReducedFace *)operator_new(uVar25);
      RVar20 = local_32[0];
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x565692;
      PackedFace::PackedFace((PackedFace *)pTVar19,RVar20,iVar14,iVar15);
      *local_60 = (long)iVar15 + 0x18;
      bVar1 = (this->super_FaceData)._res.ulog2;
      bVar12 = (this->super_FaceData)._res.vlog2;
      local_48 = (void *)CONCAT44(local_48._4_4_,this->_pixelsize << (bVar1 & 0x1f));
      p_Var5 = (pTVar19->super_TiledFaceBase).super_FaceData.super_PtexFaceData._vptr_PtexFaceData
               [6];
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x5656c3;
      iVar24 = (*p_Var5)(pTVar19);
      pvVar17 = local_68;
      iVar14 = this->_pixelsize;
      bVar7 = local_32[0].ulog2 & 0x1f;
      DVar4 = this->_dt;
      iVar15 = (int)local_48;
      *(ulong *)((long)&uStack_80 + lVar8) = (ulong)(uint)this->_nchan;
      *(ulong *)((long)aDStack_88 + lVar8) = (ulong)DVar4;
      pRVar9 = local_70;
      *(undefined8 *)((long)&uStack_90 + lVar8) = 0x5656ef;
      (*pRVar9)(pvVar17,iVar15,iVar22 << (bVar1 & 0x1f),iVar22 << (bVar12 & 0x1f),
                (void *)CONCAT44(extraout_var_02,iVar24),iVar14 << bVar7,
                *(DataType *)((long)aDStack_88 + lVar8),*(int *)((long)&uStack_80 + lVar8));
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x5656fb;
      operator_delete__(pvVar17);
    }
    else {
      iVar14 = this->_pixelsize;
      iVar10 = local_32[0].ulog2;
      iVar11 = local_32[0].vlog2;
      *(undefined8 *)((long)&uStack_80 + lVar8) = 1;
      uVar25 = *(ulong *)((long)&uStack_80 + lVar8);
      iVar15 = (int)uVar25;
      iVar24 = ((iVar15 << (iVar10 & 0x1fU)) << (iVar11 & 0x1fU)) * iVar14;
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x18;
      uVar27 = *(ulong *)((long)&uStack_80 + lVar8);
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x565428;
      pTVar19 = (TiledReducedFace *)operator_new(uVar27);
      RVar20 = local_32[0];
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x56543d;
      PackedFace::PackedFace((PackedFace *)pTVar19,RVar20,iVar14,iVar24);
      *local_60 = (long)iVar24 + 0x18;
      bVar1 = (this->_tileres).ulog2;
      local_4c = iVar15 << (bVar1 & 0x1f);
      local_60 = (size_t *)CONCAT44(local_60._4_4_,iVar15 << ((this->_tileres).vlog2 & 0x1fU));
      local_68 = (void *)CONCAT44(local_68._4_4_,this->_pixelsize << (bVar1 & 0x1f));
      local_38 = this->_pixelsize << (local_32[0].ulog2 & 0x1fU);
      uVar21 = local_38 << (local_32[0].vlog2 & 0x1fU);
      local_3c = (int)local_38 / this->_ntilesu;
      iVar14 = this->_ntilesv;
      local_50 = (int)uVar21 / iVar14 - (this->_ntilesu + -1) * local_3c;
      p_Var5 = (pTVar19->super_TiledFaceBase).super_FaceData.super_PtexFaceData._vptr_PtexFaceData
               [6];
      local_78 = pTVar19;
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x5654aa;
      iVar14 = (*p_Var5)(pTVar19,(ulong)uVar21,(long)(int)uVar21 % (long)iVar14 & 0xffffffff);
      pvVar17 = (void *)CONCAT44(extraout_var_01,iVar14);
      uVar27 = 0;
      while (pTVar19 = local_78, (long)uVar27 < (long)this->_ntiles) {
        plVar16 = (long *)local_58[uVar27];
        pcVar6 = *(code **)(*plVar16 + 0x18);
        local_48 = pvVar17;
        *(undefined8 *)((long)&uStack_80 + lVar8) = 0x5654d5;
        cVar13 = (*pcVar6)(plVar16);
        pcVar6 = *(code **)(*plVar16 + 0x30);
        *(undefined8 *)((long)&uStack_80 + lVar8) = 0x5654e1;
        pvVar18 = (void *)(*pcVar6)(plVar16);
        uVar21 = local_38;
        pvVar17 = local_48;
        iVar14 = local_4c;
        if (cVar13 == '\0') {
          DVar4 = this->_dt;
          iVar15 = (int)local_68;
          iVar24 = (int)local_60;
          *(ulong *)((long)&uStack_80 + lVar8) = (ulong)(uint)this->_nchan;
          *(ulong *)((long)aDStack_88 + lVar8) = (ulong)DVar4;
          pRVar9 = local_70;
          *(undefined8 *)((long)&uStack_90 + lVar8) = 0x565546;
          (*pRVar9)(pvVar18,iVar15,iVar14,iVar24,pvVar17,uVar21,
                    *(DataType *)((long)aDStack_88 + lVar8),*(int *)((long)&uStack_80 + lVar8));
        }
        else {
          bVar1 = local_32[0].ulog2 & 0x1f;
          iVar14 = this->_ntilesu;
          bVar12 = local_32[0].vlog2 & 0x1f;
          iVar15 = this->_ntilesv;
          iVar24 = this->_pixelsize;
          *(undefined8 *)((long)&uStack_80 + lVar8) = 0x565523;
          PtexUtils::fill(pvVar18,pvVar17,uVar21,((int)uVar25 << bVar1) / iVar14,
                          ((int)uVar25 << bVar12) / iVar15,iVar24);
        }
        uVar27 = uVar27 + 1;
        uVar21 = local_3c;
        if ((int)((long)((ulong)(uint)((int)uVar27 >> 0x1f) << 0x20 | uVar27 & 0xffffffff) %
                 (long)this->_ntilesu) == 0) {
          uVar21 = local_50;
        }
        pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar21);
        uVar25 = uVar25 & 0xffffffff;
      }
    }
    for (lVar26 = 0; lVar26 < this->_ntiles; lVar26 = lVar26 + 1) {
      pcVar6 = *(code **)(*(long *)local_58[lVar26] + 0x10);
      *(undefined8 *)((long)&uStack_80 + lVar8) = 0x565719;
      (*pcVar6)();
    }
  }
  else {
    uStack_80 = 0x5653ba;
    pTVar19 = (TiledReducedFace *)operator_new(0x60);
    uStack_80 = 0x5653d7;
    TiledReducedFace::TiledReducedFace(pTVar19,this->_reader,local_32[0],RVar20,this,local_70);
    *newMemUsed = (long)(pTVar19->super_TiledFaceBase)._tiles.
                        super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish +
                  (0x60 - (long)(pTVar19->super_TiledFaceBase)._tiles.
                                super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  }
  return (FaceData *)pTVar19;
}

Assistant:

PtexReader::FaceData*
PtexReader::TiledFaceBase::reduce(PtexReader* r, Res newres, PtexUtils::ReduceFn reducefn,
                                  size_t& newMemUsed)
{
    /* Tiled reductions should generally only be anisotropic (just u
       or v, not both) since isotropic reductions are precomputed and
       stored on disk.  (This function should still work for isotropic
       reductions though.)

       In the anisotropic case, the number of tiles should be kept the
       same along the direction not being reduced in order to preserve
       the laziness of the file access.  In contrast, if reductions
       were not tiled, then any reduction would read all the tiles and
       defeat the purpose of tiling.
    */

    // keep new face local until fully initialized
    FaceData* newface = 0;

    // don't tile triangle reductions (too complicated)
    Res newtileres;
    bool isTriangle = r->_header.meshtype == mt_triangle;
    if (isTriangle) {
        newtileres = newres;
    }
    else {
        // propagate the tile res to the reduction
        newtileres = _tileres;
        // but make sure tile isn't larger than the new face!
        if (newtileres.ulog2 > newres.ulog2) newtileres.ulog2 = newres.ulog2;
        if (newtileres.vlog2 > newres.vlog2) newtileres.vlog2 = newres.vlog2;
    }


    // determine how many tiles we will have on the reduction
    int newntiles = newres.ntiles(newtileres);

    if (newntiles == 1) {
        // no need to keep tiling, reduce tiles into a single face
        // first, get all tiles and check if they are constant (with the same value)
        PtexFaceData** tiles = (PtexFaceData**) alloca(_ntiles * sizeof(PtexFaceData*));
        bool allConstant = true;
        for (int i = 0; i < _ntiles; i++) {
            PtexFaceData* tile = tiles[i] = getTile(i);
            allConstant = (allConstant && tile->isConstant() &&
                           (i == 0 || (0 == memcmp(tiles[0]->getData(), tile->getData(),
                                                   _pixelsize))));
        }
        if (allConstant) {
            // allocate a new constant face
            newface = new ConstantFace(_pixelsize);
            memcpy(newface->getData(), tiles[0]->getData(), _pixelsize);
            newMemUsed = sizeof(ConstantFace) + _pixelsize;
        }
        else if (isTriangle) {
            // reassemble all tiles into temporary contiguous image
            // (triangle reduction doesn't work on tiles)
            int tileures = _tileres.u();
            int tilevres = _tileres.v();
            int sstride = _pixelsize * tileures;
            int dstride = sstride * _ntilesu;
            int dstepv = dstride * tilevres - sstride*(_ntilesu-1);

            char* tmp = new char [_ntiles * _tileres.size() * _pixelsize];
            char* tmpptr = tmp;
            for (int i = 0; i < _ntiles;) {
                PtexFaceData* tile = tiles[i];
                if (tile->isConstant())
                    PtexUtils::fill(tile->getData(), tmpptr, dstride,
                                    tileures, tilevres, _pixelsize);
                else
                    PtexUtils::copy(tile->getData(), sstride, tmpptr, dstride, tilevres, sstride);
                i++;
                tmpptr += (i%_ntilesu) ? sstride : dstepv;
            }

            // allocate a new packed face
            int memsize = _pixelsize * newres.size();
            newface = new PackedFace(newres, _pixelsize, memsize);
            newMemUsed = sizeof(PackedFace) + memsize;
            // reduce and copy into new face
            reducefn(tmp, _pixelsize * _res.u(), _res.u(), _res.v(),
                     newface->getData(), _pixelsize * newres.u(), _dt, _nchan);

            delete [] tmp;
        }
        else {
            // allocate a new packed face
            int memsize = _pixelsize * newres.size();
            newface = new PackedFace(newres, _pixelsize, memsize);
            newMemUsed = sizeof(PackedFace) + memsize;

            int tileures = _tileres.u();
            int tilevres = _tileres.v();
            int sstride = _pixelsize * tileures;
            int dstride = _pixelsize * newres.u();
            int dstepu = dstride/_ntilesu;
            int dstepv = dstride*newres.v()/_ntilesv - dstepu*(_ntilesu-1);

            char* dst = (char*) newface->getData();
            for (int i = 0; i < _ntiles;) {
                PtexFaceData* tile = tiles[i];
                if (tile->isConstant())
                    PtexUtils::fill(tile->getData(), dst, dstride,
                                    newres.u()/_ntilesu, newres.v()/_ntilesv,
                                    _pixelsize);
                else
                    reducefn(tile->getData(), sstride, tileures, tilevres,
                             dst, dstride, _dt, _nchan);
                i++;
                dst += (i%_ntilesu) ? dstepu : dstepv;
            }
        }
        // release the tiles
        for (int i = 0; i < _ntiles; i++) tiles[i]->release();
    }
    else {
        // otherwise, tile the reduced face
        TiledReducedFace* tf = new TiledReducedFace(_reader, newres, newtileres, this, reducefn);
        newface = tf;
        newMemUsed = tf->memUsed();
    }
    return newface;
}